

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * __thiscall
cfd::core::Privkey::CreateTweakAdd(Privkey *__return_storage_ptr__,Privkey *this,Privkey *tweak)

{
  ByteData tweak_added;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData256::ByteData256((ByteData256 *)&local_30,&tweak->data_);
  WallyUtil::AddTweakPrivkey(&tweak_added,&this->data_,(ByteData256 *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  Privkey(__return_storage_ptr__,&tweak_added,kMainnet,true);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_added);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakAdd(const Privkey &tweak) const {
  ByteData tweak_added =
      WallyUtil::AddTweakPrivkey(data_, ByteData256(tweak.data_));
  return Privkey(tweak_added);
}